

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopAddOr(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  int iVar1;
  int iVar2;
  int iVar3;
  WhereClause *pWVar4;
  WhereTerm *pWVar5;
  Bitmask *pBVar6;
  WhereTerm *pWVar7;
  ulong uVar8;
  WhereClause *pWVar9;
  bool bVar10;
  uint uVar11;
  LogEst rRun;
  LogEst nOut;
  WhereLoopBuilder *pBuilder_00;
  Bitmask in_RDX;
  WhereLoopBuilder *in_RSI;
  Bitmask *in_RDI;
  long in_FS_OFFSET;
  int j;
  int i;
  int once;
  WhereTerm *pOrTerm;
  WhereTerm *pOrWCEnd;
  WhereClause *pOrWC;
  SrcItem *pItem;
  int iCur;
  int rc;
  WhereTerm *pWCEnd;
  WhereTerm *pTerm;
  WhereLoop *pNew;
  WhereClause *pWC;
  WhereInfo *pWInfo;
  WhereLoopBuilder sSubBuild;
  WhereOrSet sPrev;
  WhereOrSet sCur;
  WhereOrSet sSum;
  WhereClause tempWC;
  WhereOrSet *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  uint in_stack_fffffffffffffcb4;
  int local_33c;
  int local_338;
  WhereTerm *local_330;
  WhereOrInfo *pTemplate;
  int local_30c;
  WhereTerm *local_300;
  Bitmask mUnusable_00;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  Bitmask in_stack_fffffffffffffd40;
  WhereOrInfo *pBuilder_01;
  Bitmask in_stack_fffffffffffffd50;
  WhereLoopBuilder *pBuilder_02;
  ushort local_298 [4];
  ulong uStack_290;
  LogEst aLStack_288 [20];
  WhereLoopBuilder local_260;
  WhereOrSet local_228;
  WhereOrInfo local_1f0;
  
  local_1f0.indexable = *(Bitmask *)(in_FS_OFFSET + 0x28);
  mUnusable_00 = *in_RDI;
  local_30c = 0;
  memset(&local_1f0,0xaa,0x1e8);
  memset(&stack0xfffffffffffffd40,0xaa,0x28);
  memset(&local_228,0xaa,0x38);
  memset(&local_260,0xaa,0x38);
  pWVar4 = (WhereClause *)in_RDI[1];
  pWVar5 = pWVar4->a;
  iVar1 = pWVar4->nTerm;
  pBVar6 = (Bitmask *)in_RDI[2];
  memset(&local_228,0,0x38);
  pBuilder_00 = (WhereLoopBuilder *)
                (*(long *)(mUnusable_00 + 8) + 8 + (long)(int)(uint)(byte)pBVar6[2] * 0x48);
  iVar2 = *(int *)((long)&pBuilder_00->pOrSet + 4);
  if (((ulong)pBuilder_00->pOrSet & 0x10) == 0) {
    for (local_300 = pWVar4->a; local_300 < pWVar5 + iVar1 && local_30c == 0;
        local_300 = local_300 + 1) {
      if (((local_300->eOperator & 0x200) != 0) &&
         ((((local_300->u).pOrInfo)->indexable & pBVar6[1]) != 0)) {
        pTemplate = (local_300->u).pOrInfo;
        pWVar7 = (pTemplate->wc).a;
        iVar3 = (pTemplate->wc).nTerm;
        bVar10 = true;
        memcpy(&stack0xfffffffffffffd40,in_RDI,0x28);
        pBuilder_02 = &local_260;
        for (local_330 = (pTemplate->wc).a; local_330 < pWVar7 + iVar3; local_330 = local_330 + 1) {
          if ((local_330->eOperator & 0x400) == 0) {
            if (local_330->leftCursor == iVar2) {
              local_1f0.wc.pWInfo = pWVar4->pWInfo;
              local_1f0.wc.op = ',';
              local_1f0.wc.nTerm = 1;
              local_1f0.wc.nBase = 1;
              local_1f0.wc.a = local_330;
              pBuilder_01 = &local_1f0;
              local_1f0.wc.pOuter = pWVar4;
              goto LAB_00204b6d;
            }
          }
          else {
            pBuilder_01 = (local_330->u).pOrInfo;
LAB_00204b6d:
            local_260.pWInfo._0_2_ = 0;
            if (pBuilder_00->pNew->field_0x3f == '\x01') {
              local_30c = whereLoopAddVirtual((WhereLoopBuilder *)pBuilder_01,
                                              in_stack_fffffffffffffd40,
                                              CONCAT44(in_stack_fffffffffffffd3c,
                                                       in_stack_fffffffffffffd38));
            }
            else {
              local_30c = whereLoopAddBtree(pBuilder_02,in_stack_fffffffffffffd50);
            }
            if (local_30c == 0) {
              local_30c = whereLoopAddOr(in_RSI,in_RDX,mUnusable_00);
            }
            if ((ushort)local_260.pWInfo == 0) {
              local_228.n = 0;
              break;
            }
            if (bVar10) {
              whereOrMove((WhereOrSet *)
                          CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                          in_stack_fffffffffffffca8);
              bVar10 = false;
            }
            else {
              memset(local_298,0xaa,0x38);
              whereOrMove((WhereOrSet *)
                          CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                          in_stack_fffffffffffffca8);
              local_228.n = 0;
              for (local_338 = 0; local_338 < (int)(uint)local_298[0]; local_338 = local_338 + 1) {
                for (local_33c = 0; local_33c < (int)(uint)(ushort)local_260.pWInfo;
                    local_33c = local_33c + 1) {
                  uVar8 = (&uStack_290)[(long)local_338 * 2];
                  pWVar9 = (&local_260.pWC)[(long)local_33c * 2];
                  rRun = sqlite3LogEstAdd(aLStack_288[(long)local_338 * 8],
                                          *(LogEst *)(&local_260.pNew + (long)local_33c * 2));
                  nOut = sqlite3LogEstAdd(aLStack_288[(long)local_338 * 8 + 1],
                                          *(LogEst *)
                                           ((long)&local_260.pNew + (long)local_33c * 0x10 + 2));
                  whereOrInsert(&local_228,uVar8 | (ulong)pWVar9,rRun,nOut);
                }
              }
            }
          }
        }
        *(undefined2 *)((long)pBVar6 + 0x34) = 1;
        *(WhereTerm **)pBVar6[8] = local_300;
        *(undefined4 *)(pBVar6 + 6) = 0x2000;
        *(undefined2 *)((long)pBVar6 + 0x12) = 0;
        *(undefined1 *)((long)pBVar6 + 0x11) = 0;
        memset(pBVar6 + 3,0,0x18);
        local_338 = 0;
        while( true ) {
          uVar11 = in_stack_fffffffffffffcb4 & 0xffffff;
          if (local_30c == 0) {
            uVar11 = CONCAT13(local_338 < (int)(uint)local_228.n,(int3)in_stack_fffffffffffffcb4);
          }
          in_stack_fffffffffffffcb4 = uVar11;
          if ((char)(in_stack_fffffffffffffcb4 >> 0x18) == '\0') break;
          *(LogEst *)((long)pBVar6 + 0x14) = local_228.a[local_338].rRun + 1;
          *(LogEst *)((long)pBVar6 + 0x16) = local_228.a[local_338].nOut;
          *pBVar6 = local_228.a[local_338].prereq;
          local_30c = whereLoopInsert(pBuilder_00,(WhereLoop *)pTemplate);
          local_338 = local_338 + 1;
        }
      }
    }
  }
  else {
    local_30c = 0;
  }
  if (*(Bitmask *)(in_FS_OFFSET + 0x28) == local_1f0.indexable) {
    return local_30c;
  }
  __stack_chk_fail();
}

Assistant:

static int whereLoopAddOr(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,
  Bitmask mUnusable
){
  WhereInfo *pWInfo = pBuilder->pWInfo;
  WhereClause *pWC;
  WhereLoop *pNew;
  WhereTerm *pTerm, *pWCEnd;
  int rc = SQLITE_OK;
  int iCur;
  WhereClause tempWC;
  WhereLoopBuilder sSubBuild;
  WhereOrSet sSum, sCur;
  SrcItem *pItem;

  pWC = pBuilder->pWC;
  pWCEnd = pWC->a + pWC->nTerm;
  pNew = pBuilder->pNew;
  memset(&sSum, 0, sizeof(sSum));
  pItem = pWInfo->pTabList->a + pNew->iTab;
  iCur = pItem->iCursor;

  /* The multi-index OR optimization does not work for RIGHT and FULL JOIN */
  if( pItem->fg.jointype & JT_RIGHT ) return SQLITE_OK;

  for(pTerm=pWC->a; pTerm<pWCEnd && rc==SQLITE_OK; pTerm++){
    if( (pTerm->eOperator & WO_OR)!=0
     && (pTerm->u.pOrInfo->indexable & pNew->maskSelf)!=0
    ){
      WhereClause * const pOrWC = &pTerm->u.pOrInfo->wc;
      WhereTerm * const pOrWCEnd = &pOrWC->a[pOrWC->nTerm];
      WhereTerm *pOrTerm;
      int once = 1;
      int i, j;

      sSubBuild = *pBuilder;
      sSubBuild.pOrSet = &sCur;

      WHERETRACE(0x400, ("Begin processing OR-clause %p\n", pTerm));
      for(pOrTerm=pOrWC->a; pOrTerm<pOrWCEnd; pOrTerm++){
        if( (pOrTerm->eOperator & WO_AND)!=0 ){
          sSubBuild.pWC = &pOrTerm->u.pAndInfo->wc;
        }else if( pOrTerm->leftCursor==iCur ){
          tempWC.pWInfo = pWC->pWInfo;
          tempWC.pOuter = pWC;
          tempWC.op = TK_AND;
          tempWC.nTerm = 1;
          tempWC.nBase = 1;
          tempWC.a = pOrTerm;
          sSubBuild.pWC = &tempWC;
        }else{
          continue;
        }
        sCur.n = 0;
#ifdef WHERETRACE_ENABLED
        WHERETRACE(0x400, ("OR-term %d of %p has %d subterms:\n",
                   (int)(pOrTerm-pOrWC->a), pTerm, sSubBuild.pWC->nTerm));
        if( sqlite3WhereTrace & 0x20000 ){
          sqlite3WhereClausePrint(sSubBuild.pWC);
        }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
        if( IsVirtual(pItem->pSTab) ){
          rc = whereLoopAddVirtual(&sSubBuild, mPrereq, mUnusable);
        }else
#endif
        {
          rc = whereLoopAddBtree(&sSubBuild, mPrereq);
        }
        if( rc==SQLITE_OK ){
          rc = whereLoopAddOr(&sSubBuild, mPrereq, mUnusable);
        }
        testcase( rc==SQLITE_NOMEM && sCur.n>0 );
        testcase( rc==SQLITE_DONE );
        if( sCur.n==0 ){
          sSum.n = 0;
          break;
        }else if( once ){
          whereOrMove(&sSum, &sCur);
          once = 0;
        }else{
          WhereOrSet sPrev;
          whereOrMove(&sPrev, &sSum);
          sSum.n = 0;
          for(i=0; i<sPrev.n; i++){
            for(j=0; j<sCur.n; j++){
              whereOrInsert(&sSum, sPrev.a[i].prereq | sCur.a[j].prereq,
                            sqlite3LogEstAdd(sPrev.a[i].rRun, sCur.a[j].rRun),
                            sqlite3LogEstAdd(sPrev.a[i].nOut, sCur.a[j].nOut));
            }
          }
        }
      }
      pNew->nLTerm = 1;
      pNew->aLTerm[0] = pTerm;
      pNew->wsFlags = WHERE_MULTI_OR;
      pNew->rSetup = 0;
      pNew->iSortIdx = 0;
      memset(&pNew->u, 0, sizeof(pNew->u));
      for(i=0; rc==SQLITE_OK && i<sSum.n; i++){
        /* TUNING: Currently sSum.a[i].rRun is set to the sum of the costs
        ** of all sub-scans required by the OR-scan. However, due to rounding
        ** errors, it may be that the cost of the OR-scan is equal to its
        ** most expensive sub-scan. Add the smallest possible penalty
        ** (equivalent to multiplying the cost by 1.07) to ensure that
        ** this does not happen. Otherwise, for WHERE clauses such as the
        ** following where there is an index on "y":
        **
        **     WHERE likelihood(x=?, 0.99) OR y=?
        **
        ** the planner may elect to "OR" together a full-table scan and an
        ** index lookup. And other similarly odd results.  */
        pNew->rRun = sSum.a[i].rRun + 1;
        pNew->nOut = sSum.a[i].nOut;
        pNew->prereq = sSum.a[i].prereq;
        rc = whereLoopInsert(pBuilder, pNew);
      }
      WHERETRACE(0x400, ("End processing OR-clause %p\n", pTerm));
    }
  }
  return rc;
}